

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_region_bounds(TCGContext_conflict9 *tcg_ctx,size_t curr_region,void **pstart,void **pend)

{
  char *local_38;
  char *end;
  char *start;
  void **pend_local;
  void **pstart_local;
  size_t curr_region_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  end = (char *)((long)(tcg_ctx->region).start_aligned + curr_region * (tcg_ctx->region).stride);
  local_38 = end + (tcg_ctx->region).size;
  if (curr_region == 0) {
    end = (char *)(tcg_ctx->region).start;
  }
  if (curr_region == (tcg_ctx->region).n - 1) {
    local_38 = (char *)(tcg_ctx->region).end;
  }
  *pstart = end;
  *pend = local_38;
  return;
}

Assistant:

static void tcg_region_bounds(TCGContext *tcg_ctx, size_t curr_region, void **pstart, void **pend)
{
    char *start, *end;

    start = (char *)tcg_ctx->region.start_aligned + curr_region * tcg_ctx->region.stride;
    end = start + tcg_ctx->region.size;

    if (curr_region == 0) {
        start = tcg_ctx->region.start;
    }
    if (curr_region == tcg_ctx->region.n - 1) {
        end = tcg_ctx->region.end;
    }

    *pstart = start;
    *pend = end;
}